

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O3

string * cmCatViews(string *__return_storage_ptr__,
                   initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                   views)

{
  string *psVar1;
  size_t __n;
  long lVar2;
  size_type sVar3;
  unsigned_long __n2;
  ulong uVar4;
  iterator ppVar5;
  ulong uVar6;
  ulong uVar7;
  string *psVar8;
  ulong uVar9;
  pointer pcVar10;
  ptrdiff_t _Num;
  size_t __n_00;
  
  sVar3 = views._M_len;
  ppVar5 = views._M_array;
  if (sVar3 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar4 = 0;
    __n_00 = 0;
    uVar9 = 0;
  }
  else {
    lVar2 = 0;
    uVar4 = 0;
    psVar8 = (string *)0x0;
    __n_00 = 0;
    uVar9 = 0;
    do {
      psVar1 = *(string **)((long)&ppVar5->second + lVar2);
      if (psVar1 != (string *)0x0) {
        if (psVar8 != (string *)0x0) {
          uVar6 = 0xf;
          uVar7 = 0xf;
          if (*(string **)psVar1 != psVar1 + 0x10) {
            uVar7 = *(ulong *)(psVar1 + 0x10);
          }
          if (*(string **)psVar8 != psVar8 + 0x10) {
            uVar6 = *(ulong *)(psVar8 + 0x10);
          }
          if (uVar7 <= uVar6) goto LAB_00125aa9;
        }
        __n_00 = *(size_t *)(psVar1 + 8);
        psVar8 = psVar1;
        uVar9 = uVar4;
      }
LAB_00125aa9:
      uVar4 = uVar4 + *(long *)((long)&(ppVar5->first)._M_len + lVar2);
      lVar2 = lVar2 + 0x18;
    } while (sVar3 * 0x18 != lVar2);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (psVar8 != (string *)0x0) {
      uVar7 = 0xf;
      if (*(string **)psVar8 != psVar8 + 0x10) {
        uVar7 = *(ulong *)(psVar8 + 0x10);
      }
      if (uVar4 <= uVar7) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,psVar8);
        goto LAB_00125b1b;
      }
    }
  }
  psVar8 = (string *)0x0;
LAB_00125b1b:
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)uVar4);
  if (__n_00 != 0 && (uVar9 != 0 && psVar8 != (string *)0x0)) {
    pcVar10 = (__return_storage_ptr__->_M_dataplus)._M_p;
    memmove(pcVar10 + uVar9,pcVar10,__n_00);
  }
  if (sVar3 != 0) {
    pcVar10 = (__return_storage_ptr__->_M_dataplus)._M_p;
    lVar2 = 0;
    do {
      if ((psVar8 == (string *)0x0) || (*(string **)((long)&ppVar5->second + lVar2) != psVar8)) {
        __n = *(size_t *)((long)&(ppVar5->first)._M_len + lVar2);
        if (__n != 0) {
          memmove(pcVar10,*(void **)((long)&(ppVar5->first)._M_str + lVar2),__n);
          pcVar10 = pcVar10 + __n;
        }
      }
      else {
        pcVar10 = pcVar10 + __n_00;
      }
      lVar2 = lVar2 + 0x18;
    } while (sVar3 * 0x18 != lVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCatViews(
  std::initializer_list<std::pair<cm::string_view, std::string*>> views)
{
  std::size_t totalSize = 0;
  std::string* rvalueString = nullptr;
  std::size_t rvalueStringLength = 0;
  std::size_t rvalueStringOffset = 0;
  for (auto const& view : views) {
    // Find the rvalue string with the largest capacity.
    if (view.second &&
        (!rvalueString ||
         view.second->capacity() > rvalueString->capacity())) {
      rvalueString = view.second;
      rvalueStringLength = rvalueString->length();
      rvalueStringOffset = totalSize;
    }
    totalSize += view.first.size();
  }

  std::string result;
  std::string::size_type initialLen = 0;
  if (rvalueString && rvalueString->capacity() >= totalSize) {
    result = std::move(*rvalueString);
  } else {
    rvalueString = nullptr;
  }
  result.resize(totalSize);
  if (rvalueString && rvalueStringOffset > 0) {
    std::copy_backward(result.begin(), result.begin() + rvalueStringLength,
                       result.begin() + rvalueStringOffset +
                         rvalueStringLength);
  }
  std::string::iterator sit = result.begin() + initialLen;
  for (auto const& view : views) {
    if (rvalueString && view.second == rvalueString) {
      sit += rvalueStringLength;
    } else {
      sit = std::copy_n(view.first.data(), view.first.size(), sit);
    }
  }
  return result;
}